

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::generateBoard(Board *this)

{
  value_type vVar1;
  int iVar2;
  size_t sVar3;
  reference pvVar4;
  size_t srcCol;
  ulong srcRow;
  int i;
  int iVar5;
  initializer_list<Move> __l;
  vector<Move,_std::allocator<Move>_> moves;
  value_type local_48 [6];
  
  sVar3 = findEmptyTilePosition(this);
  std::vector<Move,_std::allocator<Move>_>::vector(&moves,4,(allocator_type *)local_48);
  srcCol = sVar3 % 10;
  iVar5 = 0;
  srcRow = sVar3 / 10;
  do {
    if (iVar5 == 4000) {
      std::_Vector_base<Move,_std::allocator<Move>_>::~_Vector_base
                (&moves.super__Vector_base<Move,_std::allocator<Move>_>);
      return;
    }
    if (moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_finish !=
        moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
        _M_start) {
      moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data.
      _M_finish = moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    local_48[0] = UP;
    local_48[1] = RIGHT;
    local_48[2] = DOWN;
    local_48[3] = LEFT;
    __l._M_len = 4;
    __l._M_array = local_48;
    std::vector<Move,_std::allocator<Move>_>::insert
              (&moves,(const_iterator)
                      moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                      super__Vector_impl_data._M_start,__l);
    iVar2 = rand();
    pvVar4 = std::vector<Move,_std::allocator<Move>_>::at
                       (&moves,(ulong)(long)iVar2 %
                               (ulong)((long)moves.super__Vector_base<Move,_std::allocator<Move>_>.
                                             _M_impl.super__Vector_impl_data._M_finish -
                                       (long)moves.super__Vector_base<Move,_std::allocator<Move>_>.
                                             _M_impl.super__Vector_impl_data._M_start >> 2));
    while( true ) {
      vVar1 = *pvVar4;
      local_48[0] = vVar1;
      if (vVar1 == UP && srcRow != 0) break;
      if (vVar1 == DOWN) {
        if (srcRow < this->sizeInt - 1) {
          sVar3 = srcRow + 1;
          makeMove(this,srcRow,srcCol,sVar3,srcCol);
          goto LAB_00108f68;
        }
      }
      else {
        sVar3 = srcRow;
        if (vVar1 == RIGHT) {
          if (srcCol < this->sizeInt - 1) {
            makeMove(this,srcRow,srcCol,srcRow,srcCol + 1);
            srcCol = srcCol + 1;
            goto LAB_00108f68;
          }
        }
        else if (vVar1 == LEFT && srcCol != 0) {
          makeMove(this,srcRow,srcCol,srcRow,srcCol - 1);
          srcCol = srcCol - 1;
          goto LAB_00108f68;
        }
      }
      std::
      __remove_if<__gnu_cxx::__normal_iterator<Move*,std::vector<Move,std::allocator<Move>>>,__gnu_cxx::__ops::_Iter_equals_val<Move_const>>
                ((__normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_>)
                 moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                 super__Vector_impl_data._M_start,
                 (__normal_iterator<Move_*,_std::vector<Move,_std::allocator<Move>_>_>)
                 moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                 super__Vector_impl_data._M_finish,(_Iter_equals_val<const_Move>)local_48);
      iVar2 = rand();
      pvVar4 = moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.super__Vector_impl_data
               ._M_start +
               (ulong)(long)iVar2 %
               (ulong)((long)moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)moves.super__Vector_base<Move,_std::allocator<Move>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2);
    }
    sVar3 = srcRow - 1;
    makeMove(this,srcRow,srcCol,sVar3,srcCol);
LAB_00108f68:
    iVar5 = iVar5 + 1;
    srcRow = sVar3;
  } while( true );
}

Assistant:

void Board::generateBoard()
{
    size_t emptyTile = findEmptyTilePosition();
    size_t emptyRow = emptyTile / 10;
    size_t emptyCol = emptyTile % 10;

    std::vector<Move> moves( 4 );
    using enum Move;

    for ( int i = 0; i < 4000; i++ )
    {
        moves.clear();
        moves.insert( moves.begin(), { UP, RIGHT, DOWN, LEFT });
        Move move = moves.at( rand() % moves.size() );

        while( true )
        {
            if (( move == UP ) && ( emptyRow > 0 ))
            {
                makeMove( emptyRow, emptyCol, emptyRow - 1, emptyCol );
                emptyRow--;
                break;
            }
            if (( move == RIGHT ) && ( emptyCol < ( sizeInt - 1 )))
            {
                makeMove( emptyRow, emptyCol, emptyRow, emptyCol + 1 );
                emptyCol++;
                break;
            }
            if (( move == DOWN ) && ( emptyRow < ( sizeInt - 1 )))
            {
                makeMove( emptyRow, emptyCol, emptyRow + 1, emptyCol );
                emptyRow++;
                break;
            }
            if (( move == LEFT ) && ( emptyCol > 0 ))
            {
                makeMove( emptyRow, emptyCol, emptyRow, emptyCol - 1 );
                emptyCol--;
                break;
            }

            std::remove( moves.begin(), moves.end(), move );
            move = moves[ rand() % moves.size() ];
        }
    }
}